

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_build_intra_predictors_for_interintra
               (AV1_COMMON *cm,MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane,BUFFER_SET *ctx,
               uint8_t *dst,int dst_stride)

{
  int in_ECX;
  BLOCK_SIZE in_DL;
  long in_RSI;
  SequenceHeader *seq_params;
  PREDICTION_MODE mode;
  BLOCK_SIZE plane_bsize;
  int ssy;
  int ssx;
  macroblockd_plane *pd;
  PREDICTION_MODE in_stack_000000c0;
  int in_stack_000000c8;
  FILTER_INTRA_MODE in_stack_000000d8;
  uint8_t *in_stack_000000e0;
  int in_stack_000000e8;
  uint8_t *in_stack_000000f0;
  int in_stack_000000f8;
  int in_stack_00000100;
  int in_stack_00000108;
  int in_stack_00000110;
  
  get_plane_block_size
            (in_DL,*(int *)(in_RSI + (long)in_ECX * 0xa30 + 0x14),
             *(int *)(in_RSI + (long)in_ECX * 0xa30 + 0x18));
  av1_predict_intra_block
            ((MACROBLOCKD *)dst,pd._7_1_,(int)pd,ssx,ssy,plane_bsize,in_stack_000000c0,
             in_stack_000000c8,dst_stride,in_stack_000000d8,in_stack_000000e0,in_stack_000000e8,
             in_stack_000000f0,in_stack_000000f8,in_stack_00000100,in_stack_00000108,
             in_stack_00000110);
  return;
}

Assistant:

void av1_build_intra_predictors_for_interintra(const AV1_COMMON *cm,
                                               MACROBLOCKD *xd,
                                               BLOCK_SIZE bsize, int plane,
                                               const BUFFER_SET *ctx,
                                               uint8_t *dst, int dst_stride) {
  struct macroblockd_plane *const pd = &xd->plane[plane];
  const int ssx = xd->plane[plane].subsampling_x;
  const int ssy = xd->plane[plane].subsampling_y;
  BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ssx, ssy);
  PREDICTION_MODE mode = interintra_to_intra_mode[xd->mi[0]->interintra_mode];
  assert(xd->mi[0]->angle_delta[PLANE_TYPE_Y] == 0);
  assert(xd->mi[0]->angle_delta[PLANE_TYPE_UV] == 0);
  assert(xd->mi[0]->filter_intra_mode_info.use_filter_intra == 0);
  assert(xd->mi[0]->use_intrabc == 0);
  const SequenceHeader *seq_params = cm->seq_params;

  av1_predict_intra_block(xd, seq_params->sb_size,
                          seq_params->enable_intra_edge_filter, pd->width,
                          pd->height, max_txsize_rect_lookup[plane_bsize], mode,
                          0, 0, FILTER_INTRA_MODES, ctx->plane[plane],
                          ctx->stride[plane], dst, dst_stride, 0, 0, plane);
}